

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O3

void av1_warp_affine_c(int32_t *mat,uint8_t *ref,int width,int height,int stride,uint8_t *pred,
                      int p_col,int p_row,int p_width,int p_height,int p_stride,int subsampling_x,
                      int subsampling_y,ConvolveParams *conv_params,int16_t alpha,int16_t beta,
                      int16_t gamma,int16_t delta)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  int m;
  long lVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  char cVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int m_1;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int local_2d0;
  long local_2a8;
  int aiStack_218 [122];
  
  bVar1 = (byte)conv_params->round_0;
  if (conv_params->is_compound == 0) {
    bVar11 = 0xe - bVar1;
    bVar4 = (byte)conv_params->round_1;
  }
  else {
    bVar11 = (byte)conv_params->round_1;
    bVar4 = bVar11;
  }
  if (0 < p_height) {
    bVar4 = 0xe - (bVar4 + bVar1);
    iVar2 = (1 << (bVar11 & 0x1f)) >> 1;
    iVar3 = 0;
    iVar8 = p_row;
    do {
      if (0 < p_width) {
        lVar9 = (long)(iVar8 + 4 << ((byte)subsampling_y & 0x1f));
        iVar5 = (p_height + p_row) - iVar8;
        iVar13 = iVar5 + -4;
        if (8 < iVar5) {
          iVar13 = 4;
        }
        iVar5 = p_col;
        do {
          lVar14 = (long)(iVar5 + 4 << ((byte)subsampling_x & 0x1f));
          lVar19 = (long)*mat + mat[3] * lVar9 + mat[2] * lVar14 >> ((byte)subsampling_x & 0x3f);
          lVar14 = (long)mat[1] + mat[5] * lVar9 + mat[4] * lVar14 >> ((byte)subsampling_y & 0x3f);
          lVar20 = -7;
          do {
            lVar10 = (int)((ulong)lVar14 >> 0x10) + lVar20;
            iVar6 = (int)lVar10;
            iVar24 = height + -1;
            if (iVar6 < height + -1) {
              iVar24 = iVar6;
            }
            if (lVar10 < 0) {
              iVar24 = iVar3;
            }
            iVar16 = ((int)lVar20 + 4) * (int)beta +
                     (((uint)lVar19 & 0xfffc) + ((int)alpha + (int)beta) * -4 & 0xffffffc0);
            lVar10 = -4;
            iVar6 = (int)((ulong)lVar19 >> 0x10) + -7;
            do {
              iVar22 = 0x4000;
              lVar12 = 0;
              do {
                iVar18 = iVar6 + (int)lVar12;
                if (width + -1 <= iVar18) {
                  iVar18 = width + -1;
                }
                if (iVar6 + lVar12 < 0) {
                  iVar18 = iVar3;
                }
                iVar22 = iVar22 + (int)*(short *)((long)(iVar16 + 0x200 >> 10) * 0x10 + 0x55d570 +
                                                 lVar12 * 2) * (uint)ref[iVar18 + iVar24 * stride];
                lVar12 = lVar12 + 1;
              } while (lVar12 != 8);
              aiStack_218[lVar20 * 8 + 0x3c + lVar10] =
                   iVar22 + ((1 << (bVar1 & 0x1f)) >> 1) >> (bVar1 & 0x1f);
              iVar16 = iVar16 + alpha;
              lVar10 = lVar10 + 1;
              iVar6 = iVar6 + 1;
            } while (lVar10 != 4);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 8);
          if (-4 < iVar13) {
            iVar6 = (p_width + p_col) - iVar5;
            iVar24 = iVar6 + -4;
            if (8 < iVar6) {
              iVar24 = 4;
            }
            iVar6 = (iVar5 - p_col) + 4;
            local_2a8 = -4;
            local_2d0 = 0;
            do {
              if (-4 < iVar24) {
                iVar22 = (iVar8 - p_row) + 4 + (int)local_2a8;
                iVar18 = iVar22 * p_stride;
                iVar15 = ((int)local_2a8 + 4) * (int)delta +
                         (((uint)lVar14 & 0xfffc) + ((int)gamma + (int)delta) * -4 & 0xffffffc0);
                lVar19 = -4;
                iVar16 = local_2d0;
                do {
                  lVar20 = 0;
                  iVar25 = 1 << (0x16 - bVar1 & 0x1f);
                  iVar23 = iVar16;
                  do {
                    iVar25 = iVar25 + (int)*(short *)((long)(iVar15 + 0x200 >> 10) * 0x10 + 0x55d570
                                                     + lVar20 * 2) * aiStack_218[iVar23];
                    lVar20 = lVar20 + 1;
                    iVar23 = iVar23 + 8;
                  } while (lVar20 != 8);
                  if (conv_params->is_compound == 0) {
                    iVar23 = iVar25 + iVar2 >> (bVar11 & 0x1f);
                    if (iVar23 < 0x181) {
                      iVar23 = 0x180;
                    }
                    uVar7 = iVar23 - 0x180U;
                    if (0xfe < iVar23 - 0x180U) {
                      uVar7 = 0xff;
                    }
                    pred[iVar6 + iVar18 + (int)lVar19] = (uint8_t)uVar7;
                  }
                  else {
                    iVar21 = iVar6 + (int)lVar19;
                    iVar25 = iVar25 + iVar2 >> (bVar11 & 0x1f);
                    iVar23 = conv_params->dst_stride * iVar22 + iVar21;
                    if (conv_params->do_average == 0) {
                      conv_params->dst[iVar23] = (CONV_BUF_TYPE)iVar25;
                    }
                    else {
                      uVar7 = (uint)conv_params->dst[iVar23];
                      if (conv_params->use_dist_wtd_comp_avg == 0) {
                        iVar23 = (int)(iVar25 + uVar7) >> 1;
                      }
                      else {
                        iVar23 = (int)(iVar25 * conv_params->bck_offset +
                                      uVar7 * conv_params->fwd_offset) >> 4;
                      }
                      cVar17 = (char)conv_params->round_1 + bVar1;
                      iVar23 = (-1 << (0x15U - cVar17 & 0x1f)) +
                               (-1 << (0x16U - cVar17 & 0x1f)) + ((1 << (bVar4 & 0x1f)) >> 1) +
                               iVar23 >> (bVar4 & 0x1f);
                      if (iVar23 < 1) {
                        iVar23 = iVar3;
                      }
                      if (0xfe < iVar23) {
                        iVar23 = 0xff;
                      }
                      pred[iVar21 + iVar18] = (uint8_t)iVar23;
                    }
                  }
                  iVar15 = iVar15 + gamma;
                  lVar19 = lVar19 + 1;
                  iVar16 = iVar16 + 1;
                } while (lVar19 < iVar24);
              }
              local_2a8 = local_2a8 + 1;
              local_2d0 = local_2d0 + 8;
            } while (local_2a8 < iVar13);
          }
          iVar5 = iVar5 + 8;
        } while (iVar5 < p_width + p_col);
      }
      iVar8 = iVar8 + 8;
    } while (iVar8 < p_height + p_row);
  }
  return;
}

Assistant:

void av1_warp_affine_c(const int32_t *mat, const uint8_t *ref, int width,
                       int height, int stride, uint8_t *pred, int p_col,
                       int p_row, int p_width, int p_height, int p_stride,
                       int subsampling_x, int subsampling_y,
                       ConvolveParams *conv_params, int16_t alpha, int16_t beta,
                       int16_t gamma, int16_t delta) {
  int32_t tmp[15 * 8];
  const int bd = 8;
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int max_bits_horiz = bd + FILTER_BITS + 1 - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  (void)max_bits_horiz;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));
  assert(IMPLIES(conv_params->do_average, conv_params->is_compound));

  for (int i = p_row; i < p_row + p_height; i += 8) {
    for (int j = p_col; j < p_col + p_width; j += 8) {
      // Calculate the center of this 8x8 block,
      // project to luma coordinates (if in a subsampled chroma plane),
      // apply the affine transformation,
      // then convert back to the original coordinates (if necessary)
      const int32_t src_x = (j + 4) << subsampling_x;
      const int32_t src_y = (i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      sx4 += alpha * (-4) + beta * (-4);
      sy4 += gamma * (-4) + delta * (-4);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      for (int k = -7; k < 8; ++k) {
        // Clamp to top/bottom edge of the frame
        const int iy = clamp(iy4 + k, 0, height - 1);

        int sx = sx4 + beta * (k + 4);

        for (int l = -4; l < 4; ++l) {
          int ix = ix4 + l - 3;
          // At this point, sx = sx4 + alpha * l + beta * k
          const int offs = ROUND_POWER_OF_TWO(sx, WARPEDDIFF_PREC_BITS) +
                           WARPEDPIXEL_PREC_SHIFTS;
          assert(offs >= 0 && offs <= WARPEDPIXEL_PREC_SHIFTS * 3);
          const WarpedFilterCoeff *coeffs = av1_warped_filter[offs];

          int32_t sum = 1 << offset_bits_horiz;
          for (int m = 0; m < 8; ++m) {
            // Clamp to left/right edge of the frame
            const int sample_x = clamp(ix + m, 0, width - 1);

            sum += ref[iy * stride + sample_x] * coeffs[m];
          }
          sum = ROUND_POWER_OF_TWO(sum, reduce_bits_horiz);
          assert(0 <= sum && sum < (1 << max_bits_horiz));
          tmp[(k + 7) * 8 + (l + 4)] = sum;
          sx += alpha;
        }
      }

      // Vertical filter
      for (int k = -4; k < AOMMIN(4, p_row + p_height - i - 4); ++k) {
        int sy = sy4 + delta * (k + 4);
        for (int l = -4; l < AOMMIN(4, p_col + p_width - j - 4); ++l) {
          // At this point, sy = sy4 + gamma * l + delta * k
          const int offs = ROUND_POWER_OF_TWO(sy, WARPEDDIFF_PREC_BITS) +
                           WARPEDPIXEL_PREC_SHIFTS;
          assert(offs >= 0 && offs <= WARPEDPIXEL_PREC_SHIFTS * 3);
          const WarpedFilterCoeff *coeffs = av1_warped_filter[offs];

          int32_t sum = 1 << offset_bits_vert;
          for (int m = 0; m < 8; ++m) {
            sum += tmp[(k + m + 4) * 8 + (l + 4)] * coeffs[m];
          }

          if (conv_params->is_compound) {
            CONV_BUF_TYPE *p =
                &conv_params
                     ->dst[(i - p_row + k + 4) * conv_params->dst_stride +
                           (j - p_col + l + 4)];
            sum = ROUND_POWER_OF_TWO(sum, reduce_bits_vert);
            if (conv_params->do_average) {
              uint8_t *dst8 =
                  &pred[(i - p_row + k + 4) * p_stride + (j - p_col + l + 4)];
              int32_t tmp32 = *p;
              if (conv_params->use_dist_wtd_comp_avg) {
                tmp32 = tmp32 * conv_params->fwd_offset +
                        sum * conv_params->bck_offset;
                tmp32 = tmp32 >> DIST_PRECISION_BITS;
              } else {
                tmp32 += sum;
                tmp32 = tmp32 >> 1;
              }
              tmp32 = tmp32 - (1 << (offset_bits - conv_params->round_1)) -
                      (1 << (offset_bits - conv_params->round_1 - 1));
              *dst8 = clip_pixel(ROUND_POWER_OF_TWO(tmp32, round_bits));
            } else {
              *p = sum;
            }
          } else {
            uint8_t *p =
                &pred[(i - p_row + k + 4) * p_stride + (j - p_col + l + 4)];
            sum = ROUND_POWER_OF_TWO(sum, reduce_bits_vert);
            assert(0 <= sum && sum < (1 << (bd + 2)));
            *p = clip_pixel(sum - (1 << (bd - 1)) - (1 << bd));
          }
          sy += gamma;
        }
      }
    }
  }
}